

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcShow.c
# Opt level: O3

void Abc_NtkShowBdd(Abc_Ntk_t *pNtk,int fCompl)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  DdManager *dd;
  uint *__ptr;
  void *pvVar4;
  undefined8 uVar5;
  FILE *__stream;
  char **inames;
  char **onames;
  DdNode **f;
  DdNode *n;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  Vec_Ptr_t *pVVar12;
  long lVar13;
  char FileNameDot [200];
  char local_f8 [200];
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcShow.c"
                  ,0x85,"void Abc_NtkShowBdd(Abc_Ntk_t *, int)");
  }
  dd = (DdManager *)Abc_NtkBuildGlobalBdds(pNtk,10000000,1,1,0,0);
  if (dd == (DdManager *)0x0) {
    puts("Construction of global BDDs has failed.");
    return;
  }
  pVVar12 = pNtk->vCos;
  uVar1 = pVVar12->nSize;
  __ptr = (uint *)malloc(0x10);
  uVar6 = 8;
  if (6 < uVar1 - 1) {
    uVar6 = (ulong)uVar1;
  }
  __ptr[1] = 0;
  uVar8 = 0;
  if ((int)uVar6 == 0) {
    pvVar4 = (void *)0x0;
  }
  else {
    pvVar4 = malloc((long)(int)uVar6 << 3);
  }
  *(void **)(__ptr + 2) = pvVar4;
  if (0 < (int)uVar1) {
    uVar9 = 0;
    do {
      lVar13 = *(long *)(*pVVar12->pArray[uVar9] + 0x1b0);
      if (*(int *)(lVar13 + 4) < 8) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      piVar3 = *(int **)(*(long *)(lVar13 + 8) + 0x38);
      pvVar4 = *(void **)(piVar3 + 2);
      if (pvVar4 == (void *)0x0) {
        __assert_fail("p->pArrayPtr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecAtt.h"
                      ,0xf9,"void *Vec_AttEntry(Vec_Att_t *, int)");
      }
      iVar7 = (int)*(long *)((long)pVVar12->pArray[uVar9] + 0x10);
      lVar13 = (long)iVar7;
      iVar2 = *piVar3;
      if (iVar2 <= iVar7) {
        iVar11 = iVar7 + 10;
        if (iVar7 < iVar2 * 2) {
          iVar11 = iVar2 * 2;
        }
        if (iVar2 < iVar11) {
          pvVar4 = realloc(pvVar4,(long)iVar11 * 8);
          *(void **)(piVar3 + 2) = pvVar4;
          memset((void *)((long)pvVar4 + (long)*piVar3 * 8),0,((long)iVar11 - (long)*piVar3) * 8);
          *piVar3 = iVar11;
        }
      }
      lVar10 = *(long *)((long)pvVar4 + lVar13 * 8);
      if (lVar10 == 0) {
        if (*(code **)(piVar3 + 8) == (code *)0x0) {
          lVar10 = 0;
        }
        else {
          uVar5 = (**(code **)(piVar3 + 8))(*(undefined8 *)(piVar3 + 4));
          *(undefined8 *)(*(long *)(piVar3 + 2) + lVar13 * 8) = uVar5;
          lVar10 = *(long *)(*(long *)(piVar3 + 2) + lVar13 * 8);
        }
      }
      iVar7 = (int)uVar6;
      if ((int)uVar9 == iVar7) {
        if (iVar7 < 0x10) {
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar4 = malloc(0x80);
          }
          else {
            pvVar4 = realloc(*(void **)(__ptr + 2),0x80);
          }
          *(void **)(__ptr + 2) = pvVar4;
          *__ptr = 0x10;
          uVar6 = 0x10;
        }
        else {
          uVar6 = (ulong)(uint)(iVar7 * 2);
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar4 = malloc(uVar6 * 8);
          }
          else {
            pvVar4 = realloc(*(void **)(__ptr + 2),uVar6 * 8);
          }
          *(void **)(__ptr + 2) = pvVar4;
          *__ptr = iVar7 * 2;
        }
      }
      else {
        pvVar4 = *(void **)(__ptr + 2);
      }
      uVar8 = uVar9 + 1;
      __ptr[1] = (uint)uVar8;
      *(long *)((long)pvVar4 + uVar9 * 8) = lVar10;
      pVVar12 = pNtk->vCos;
      uVar9 = uVar8;
    } while ((long)uVar8 < (long)pVVar12->nSize);
  }
  Abc_ShowGetFileName(pNtk->pName,local_f8);
  __stream = fopen(local_f8,"w");
  if (__stream == (FILE *)0x0) {
    fprintf(_stdout,"Cannot open the intermediate file \"%s\".\n",local_f8);
    return;
  }
  inames = Abc_NtkCollectCioNames(pNtk,0);
  onames = Abc_NtkCollectCioNames(pNtk,1);
  iVar7 = (int)uVar8;
  if (fCompl == 0) {
    f = (DdNode **)malloc((long)iVar7 * 8);
    if (iVar7 < 1) {
      Cudd_DumpDot(dd,pNtk->vCos->nSize,f,inames,onames,(FILE *)__stream);
      if (f == (DdNode **)0x0) goto LAB_00871d7e;
    }
    else {
      lVar13 = *(long *)(__ptr + 2);
      uVar6 = 0;
      do {
        n = Cudd_BddToAdd(dd,*(DdNode **)(lVar13 + uVar6 * 8));
        f[uVar6] = n;
        Cudd_Ref(n);
        uVar6 = uVar6 + 1;
      } while ((uVar8 & 0xffffffff) != uVar6);
      Cudd_DumpDot(dd,pNtk->vCos->nSize,f,inames,onames,(FILE *)__stream);
      if (0 < iVar7) {
        uVar6 = 0;
        do {
          Cudd_RecursiveDeref(dd,f[uVar6]);
          uVar6 = uVar6 + 1;
        } while ((uVar8 & 0xffffffff) != uVar6);
      }
    }
    free(f);
  }
  else {
    Cudd_DumpDot(dd,pNtk->vCos->nSize,*(DdNode ***)(__ptr + 2),inames,onames,(FILE *)__stream);
  }
LAB_00871d7e:
  if (inames != (char **)0x0) {
    free(inames);
  }
  if (onames != (char **)0x0) {
    free(onames);
  }
  fclose(__stream);
  Abc_NtkFreeGlobalBdds(pNtk,0);
  pvVar4 = *(void **)(__ptr + 2);
  if (iVar7 < 1) {
    if (pvVar4 == (void *)0x0) goto LAB_00871de8;
  }
  else {
    uVar6 = 0;
    do {
      Cudd_RecursiveDeref(dd,*(DdNode **)((long)pvVar4 + uVar6 * 8));
      uVar6 = uVar6 + 1;
    } while ((uVar8 & 0xffffffff) != uVar6);
  }
  free(pvVar4);
LAB_00871de8:
  free(__ptr);
  Extra_StopManager(dd);
  Abc_NtkCleanCopy(pNtk);
  Abc_ShowFile(local_f8);
  return;
}

Assistant:

void Abc_NtkShowBdd( Abc_Ntk_t * pNtk, int fCompl )
{
    char FileNameDot[200];
    char ** ppNamesIn, ** ppNamesOut;
    DdManager * dd; DdNode * bFunc;
    Vec_Ptr_t * vFuncsGlob;
    Abc_Obj_t * pObj; int i;
    FILE * pFile;

    assert( Abc_NtkIsStrash(pNtk) );
    dd = (DdManager *)Abc_NtkBuildGlobalBdds( pNtk, 10000000, 1, 1, 0, 0 );
    if ( dd == NULL )
    {
        printf( "Construction of global BDDs has failed.\n" );
        return;
    }
    //printf( "Shared BDD size = %6d nodes.\n", Cudd_ReadKeys(dd) - Cudd_ReadDead(dd) );

    // complement the global functions
    vFuncsGlob = Vec_PtrAlloc( Abc_NtkCoNum(pNtk) );
    Abc_NtkForEachCo( pNtk, pObj, i )
        Vec_PtrPush( vFuncsGlob, Abc_ObjGlobalBdd(pObj) );

    // create the file name
    Abc_ShowGetFileName( pNtk->pName, FileNameDot );
    // check that the file can be opened
    if ( (pFile = fopen( FileNameDot, "w" )) == NULL )
    {
        fprintf( stdout, "Cannot open the intermediate file \"%s\".\n", FileNameDot );
        return;
    }

    // set the node names 
    ppNamesIn = Abc_NtkCollectCioNames( pNtk, 0 );
    ppNamesOut = Abc_NtkCollectCioNames( pNtk, 1 );
    if ( fCompl )
        Cudd_DumpDot( dd, Abc_NtkCoNum(pNtk), (DdNode **)Vec_PtrArray(vFuncsGlob), ppNamesIn, ppNamesOut, pFile );
    else
    {
        DdNode ** pbAdds = ABC_ALLOC( DdNode *, Vec_PtrSize(vFuncsGlob) );
        Vec_PtrForEachEntry( DdNode *, vFuncsGlob, bFunc, i )
            { pbAdds[i] = Cudd_BddToAdd( dd, bFunc ); Cudd_Ref( pbAdds[i] ); }
        Cudd_DumpDot( dd, Abc_NtkCoNum(pNtk), pbAdds, ppNamesIn, ppNamesOut, pFile );
        Vec_PtrForEachEntry( DdNode *, vFuncsGlob, bFunc, i )
            Cudd_RecursiveDeref( dd, pbAdds[i] );
        ABC_FREE( pbAdds );
    }
    ABC_FREE( ppNamesIn );
    ABC_FREE( ppNamesOut );
    fclose( pFile );

    // cleanup
    Abc_NtkFreeGlobalBdds( pNtk, 0 );
    Vec_PtrForEachEntry( DdNode *, vFuncsGlob, bFunc, i )
        Cudd_RecursiveDeref( dd, bFunc );
    Vec_PtrFree( vFuncsGlob );
    Extra_StopManager( dd );
    Abc_NtkCleanCopy( pNtk );

    // visualize the file 
    Abc_ShowFile( FileNameDot );
}